

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O0

int __thiscall KryoFlux::SelectDevice(KryoFlux *this,int device)

{
  int iVar1;
  string local_38;
  int local_14;
  KryoFlux *pKStack_10;
  int device_local;
  KryoFlux *this_local;
  
  local_14 = device;
  pKStack_10 = this;
  (**(code **)(*(long *)this + 0x18))(&local_38,this,6,device,0);
  iVar1 = ResponseCode(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

int KryoFlux::SelectDevice(int device)
{
    return ResponseCode(Control(REQ_DEVICE, device));
}